

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

env * __thiscall lest::env::context_abi_cxx11_(env *this)

{
  long in_RSI;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  env *this_local;
  
  this_local = this;
  sections_abi_cxx11_((env *)local_58);
  std::operator+(local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (in_RSI + 0x20));
  std::__cxx11::string::string((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  return this;
}

Assistant:

text context() { return testing + sections(); }